

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O3

bool helics::checkUnitMatch(string *unit1,string *unit2,bool strict_match)

{
  size_t __n;
  pointer pcVar1;
  int iVar2;
  uint64_t uVar3;
  bool bVar4;
  unit_data uVar5;
  unit_data uVar6;
  double dVar7;
  precise_unit pVar8;
  precise_unit pVar9;
  precise_unit u2;
  precise_unit u1;
  string local_88;
  string local_68;
  precise_unit local_48;
  precise_unit local_38;
  
  __n = unit1->_M_string_length;
  bVar4 = true;
  if (__n != 0) {
    if ((__n == unit2->_M_string_length) &&
       (iVar2 = bcmp((unit1->_M_dataplus)._M_p,(unit2->_M_dataplus)._M_p,__n), iVar2 == 0)) {
      return true;
    }
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (unit1,"def");
    if ((((iVar2 != 0) &&
         (iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(unit1,"any"), iVar2 != 0)) && (unit2->_M_string_length != 0)) &&
       ((iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 compare(unit2,"def"), iVar2 != 0 &&
        (iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 compare(unit2,"any"), iVar2 != 0)))) {
      pcVar1 = (unit1->_M_dataplus)._M_p;
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar1,pcVar1 + unit1->_M_string_length);
      uVar3 = ::units::getDefaultFlags();
      pVar8 = ::units::unit_from_string(&local_68,uVar3);
      local_38 = pVar8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      pcVar1 = (unit2->_M_dataplus)._M_p;
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,pcVar1,pcVar1 + unit2->_M_string_length);
      uVar3 = ::units::getDefaultFlags();
      pVar9 = ::units::unit_from_string(&local_88,uVar3);
      local_48 = pVar9;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      uVar6 = pVar8.base_units_;
      if ((uVar6 == (unit_data)0xfa94a488 && NAN(pVar8.multiplier_)) ||
         (uVar5 = pVar9.base_units_, uVar5 == (unit_data)0xfa94a488 && NAN(pVar9.multiplier_))) {
        bVar4 = false;
      }
      else if (strict_match) {
        bVar4 = !NAN(pVar8.multiplier_ / pVar9.multiplier_) &&
                (-1 < (int)((uint)uVar5 | (uint)uVar6) && uVar5 == uVar6);
      }
      else {
        dVar7 = ::units::convert<units::precise_unit,units::precise_unit>(1.0,&local_38,&local_48);
        bVar4 = !NAN(dVar7);
      }
    }
  }
  return bVar4;
}

Assistant:

bool checkUnitMatch(const std::string& unit1, const std::string& unit2, bool strict_match)
{
    if ((unit1.empty()) || (unit1 == unit2) || (unit1 == "def") || (unit1 == "any")) {
        return true;
    }

    if ((unit2.empty()) || (unit2 == "def") || (unit2 == "any")) {
        return true;
    }
    auto u1 = units::unit_from_string(unit1);
    auto u2 = units::unit_from_string(unit2);

    if (!units::is_valid(u1) || !units::is_valid(u2)) {
        return false;
    }
    if (strict_match) {
        double conv = units::quick_convert(u1, u2);
        return (!std::isnan(conv));
    }
    double conv = units::convert(u1, u2);
    return (!std::isnan(conv));
}